

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O3

void aom_wb_write_signed_primitive_refsubexpfin
               (aom_write_bit_buffer *wb,uint16_t n,uint16_t k,int16_t ref,int16_t v)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  uVar5 = (uint)n;
  uVar1 = (uVar5 - 1) + (uint)(ushort)ref;
  uVar7 = (uVar5 - 1) + (uint)(ushort)v;
  uVar2 = (uVar1 & 0xffff) * 2;
  uVar8 = uVar5 * 2 - 1 & 0xffff;
  if (uVar8 < uVar2) {
    iVar6 = uVar5 * 2 + -2;
    uVar1 = iVar6 - uVar1;
    uVar7 = iVar6 - uVar7;
    if ((uVar1 & 0xffff) * 2 < (uVar7 & 0xffff)) goto LAB_00258d10;
    if ((ushort)uVar7 < (ushort)uVar1) {
      uVar7 = (uVar1 - uVar7) * 2 - 1;
      goto LAB_00258d10;
    }
    iVar6 = uVar7 - uVar1;
  }
  else {
    if (uVar2 < (uVar7 & 0xffff)) goto LAB_00258d10;
    if ((ushort)uVar7 < (ushort)uVar1) {
      uVar7 = (uVar1 - uVar7) * 2 - 1;
      goto LAB_00258d10;
    }
    iVar6 = uVar7 - uVar1;
  }
  uVar7 = iVar6 * 2;
LAB_00258d10:
  iVar6 = 0;
  if (3 << ((byte)k & 0x1f) < (int)uVar8) {
    uVar2 = uVar7 & 0xffff;
    uVar1 = (uint)k;
    uVar5 = (uint)k;
    iVar9 = 0;
    iVar3 = iVar6;
    do {
      iVar6 = (1 << ((byte)uVar1 & 0x1f)) + iVar9;
      aom_wb_write_bit(wb,(uint)(iVar6 <= (int)uVar2));
      if ((int)uVar2 < iVar6) {
        if ((int)uVar1 < 1) {
          return;
        }
        uVar1 = uVar1 + 1;
        do {
          aom_wb_write_bit(wb,(uint)((uVar2 - iVar9 >> (uVar1 - 2 & 0x1f) & 1) != 0));
          uVar1 = uVar1 - 1;
        } while (1 < uVar1);
        return;
      }
      bVar4 = (byte)uVar5;
      uVar1 = iVar3 + (uint)k;
      uVar5 = uVar5 + 1;
      iVar9 = iVar6;
      iVar3 = iVar3 + 1;
    } while ((3 << (bVar4 & 0x1f)) + iVar6 < (int)uVar8);
  }
  if (1 < (ushort)(uVar8 - iVar6)) {
    uVar5 = uVar8 - iVar6 & 0xffff;
    iVar9 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    iVar3 = (2 << ((byte)iVar9 & 0x1f)) - uVar5;
    uVar7 = uVar7 - iVar6 & 0xffff;
    if (iVar3 <= (int)uVar7) {
      uVar5 = iVar9 + 1;
      do {
        aom_wb_write_bit(wb,(uint)(((uint)(((int)(uVar7 - iVar3) >> 1) + iVar3) >>
                                    (uVar5 - 2 & 0x1f) & 1) != 0));
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      aom_wb_write_bit(wb,uVar7 - iVar3 & 1);
      return;
    }
    uVar5 = iVar9 + 1;
    do {
      aom_wb_write_bit(wb,(uint)((uVar7 >> (uVar5 - 2 & 0x1f) & 1) != 0));
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return;
}

Assistant:

void aom_wb_write_signed_primitive_refsubexpfin(struct aom_write_bit_buffer *wb,
                                                uint16_t n, uint16_t k,
                                                int16_t ref, int16_t v) {
  ref += n - 1;
  v += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  wb_write_primitive_refsubexpfin(wb, scaled_n, k, ref, v);
}